

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall
aeron::archive::AeronArchive::pollNextResponse
          (AeronArchive *this,int64_t correlationId,TimePoint *deadline)

{
  bool bVar1;
  pointer pCVar2;
  element_type *this_00;
  ArchiveException *pAVar3;
  char *pcVar4;
  element_type *this_01;
  AgentInvoker<aeron::ClientConductor> *this_02;
  undefined8 in_RCX;
  nfds_t __nfds;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  undefined1 local_38 [28];
  int32_t fragments;
  TimePoint *deadline_local;
  int64_t correlationId_local;
  AeronArchive *this_local;
  
  unique0x100003a8 = (pollfd *)deadline;
  deadline_local = (TimePoint *)correlationId;
  correlationId_local = (int64_t)this;
  while( true ) {
    do {
      pCVar2 = std::
               unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               ::operator->(&this->controlResponsePoller_);
      local_38._20_4_ =
           ControlResponsePoller::poll(pCVar2,(pollfd *)correlationId,__nfds,(int)in_RCX);
      pCVar2 = std::
               unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               ::operator->(&this->controlResponsePoller_);
      bVar1 = ControlResponsePoller::isPollComplete(pCVar2);
      if (bVar1) {
        return;
      }
    } while (0 < (int)local_38._20_4_);
    std::
    unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
    ::operator->(&this->controlResponsePoller_);
    ControlResponsePoller::subscription((ControlResponsePoller *)local_38);
    this_00 = std::
              __shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
    bVar1 = Subscription::isConnected(this_00);
    std::shared_ptr<aeron::Subscription>::~shared_ptr((shared_ptr<aeron::Subscription> *)local_38);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    local_c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    correlationId = (int64_t)stack0xffffffffffffffe0;
    bVar1 = std::chrono::operator>
                      (&local_c8,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)stack0xffffffffffffffe0);
    if (bVar1) {
      pAVar3 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_108,(long)deadline_local);
      std::operator+(&local_e8,"awaiting response for correlationId=",&local_108);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_128,
                 "void aeron::archive::AeronArchive::pollNextResponse(std::int64_t, const TimePoint &)"
                 ,&local_129);
      pcVar4 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_150,pcVar4,&local_151);
      ArchiveException::ArchiveException(pAVar3,&local_e8,&local_128,&local_150,0x18c);
      __cxa_throw(pAVar3,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
    }
    concurrent::YieldingIdleStrategy::idle((YieldingIdleStrategy *)&this->field_0x138);
    this_01 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->aeron_);
    this_02 = Aeron::conductorAgentInvoker(this_01);
    concurrent::AgentInvoker<aeron::ClientConductor>::invoke(this_02);
  }
  local_ba = 1;
  pAVar3 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"subscription to archive is not connected",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,
             "void aeron::archive::AeronArchive::pollNextResponse(std::int64_t, const TimePoint &)",
             &local_91);
  pcVar4 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,pcVar4,&local_b9);
  ArchiveException::ArchiveException(pAVar3,&local_68,&local_90,&local_b8,0x188);
  local_ba = 0;
  __cxa_throw(pAVar3,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
}

Assistant:

void AeronArchive::pollNextResponse(std::int64_t correlationId, const TimePoint& deadline) {
    while (true) {
        std::int32_t fragments = controlResponsePoller_->poll();

        if (controlResponsePoller_->isPollComplete()) {
            break;
        }

        if (fragments > 0) {
            continue;
        }

        if (!controlResponsePoller_->subscription()->isConnected()) {
            throw ArchiveException("subscription to archive is not connected", SOURCEINFO);
        }

        if (Clock::now() > deadline) {
            throw ArchiveException("awaiting response for correlationId=" + std::to_string(correlationId), SOURCEINFO);
        }

        idleStrategy_.idle();
        aeron_->conductorAgentInvoker().invoke();
    }
}